

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O0

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  int iVar6;
  CacheEntryType CVar7;
  size_type sVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  const_reference pvVar12;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pcVar13;
  char *pcVar14;
  long lVar15;
  cmState *this_00;
  char *pcVar16;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  byte local_213;
  byte local_212;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  char *local_1c8;
  char *existingValue;
  cmState *state;
  size_type cacheStart;
  string local_1a8;
  allocator local_181;
  string local_180;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_160;
  string local_150;
  uint local_12c;
  char *pcStack_128;
  uint ignoreLastArgs;
  char *docstring;
  CacheEntryType type;
  bool parentScope;
  bool force;
  bool cache;
  string value;
  string local_f0;
  allocator local_c9;
  string local_c8;
  undefined4 local_a4;
  char *local_a0;
  char *currValue;
  undefined1 local_90 [8];
  string putEnvArg;
  char *varName;
  char *variable;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSetCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004eb7ed;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local,0);
  varName = (char *)std::__cxx11::string::c_str();
  bVar5 = cmHasLiteralPrefix<char_const*,5ul>(&varName,(char (*) [5])"ENV{");
  if ((!bVar5) || (sVar9 = strlen(varName), sVar9 < 6)) {
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    pcVar14 = varName;
    if (sVar8 == 1) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,pcVar14,&local_c9);
      cmMakefile::RemoveDefinition(pcVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      this_local._7_1_ = 1;
      goto LAB_004eb7ed;
    }
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    pcVar4 = param_2_local;
    if (sVar8 == 2) {
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar8 - 1);
      bVar5 = std::operator==(pvVar12,"PARENT_SCOPE");
      pcVar14 = varName;
      if (bVar5) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,pcVar14,(allocator *)(value.field_2._M_local_buf + 0xf));
        cmMakefile::RaiseScope(pcVar1,&local_f0,(char *)0x0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 1;
        goto LAB_004eb7ed;
      }
    }
    std::__cxx11::string::string((string *)&type);
    docstring._7_1_ = 0;
    docstring._6_1_ = 0;
    docstring._5_1_ = 0;
    docstring._0_4_ = STRING;
    pcStack_128 = (char *)0x0;
    local_12c = 0;
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    pcVar4 = param_2_local;
    if (sVar8 < 2) {
LAB_004eaf6c:
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pcVar4 = param_2_local;
      if (4 < sVar8) {
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pcVar4,sVar8 - 1);
        bVar5 = std::operator==(pvVar12,"FORCE");
        if (bVar5) {
          docstring._6_1_ = 1;
          local_12c = local_12c + 1;
        }
      }
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pcVar4 = param_2_local;
      if (3 < sVar8) {
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pcVar4,(sVar8 - (docstring._6_1_ & 1)) - 3);
        bVar5 = std::operator==(pvVar12,"CACHE");
        if (bVar5) {
          docstring._7_1_ = 1;
          local_12c = local_12c + 3;
        }
      }
    }
    else {
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar8 - 1);
      bVar5 = std::operator==(pvVar12,"PARENT_SCOPE");
      if (!bVar5) goto LAB_004eaf6c;
      docstring._5_1_ = 1;
      local_12c = local_12c + 1;
    }
    local_160 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
    pcVar13 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_160,1);
    pcVar13 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::retreat(pcVar13,(ulong)local_12c);
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_150,pcVar13,";");
    std::__cxx11::string::operator=((string *)&type,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    pcVar4 = param_2_local;
    pcVar14 = varName;
    if ((docstring._5_1_ & 1) == 0) {
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar8 - 1);
      bVar5 = std::operator==(pvVar12,"CACHE");
      if (!bVar5) {
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
        pcVar4 = param_2_local;
        if (1 < sVar8) {
          sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          pvVar12 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)pcVar4,sVar8 - 2);
          bVar5 = std::operator==(pvVar12,"CACHE");
          if (bVar5) goto LAB_004eb28a;
        }
        if (((docstring._6_1_ & 1) == 0) || ((docstring._7_1_ & 1) != 0)) {
          if ((docstring._7_1_ & 1) != 0) {
            sVar8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            lVar15 = sVar8 - (docstring._6_1_ & 1);
            state = (cmState *)(lVar15 + -3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,lVar15 - 2);
            pcVar14 = (char *)std::__cxx11::string::c_str();
            docstring._0_4_ = cmState::StringToCacheEntryType(pcVar14);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,
                         (size_type)&(state->PropertyDefinitions)._M_t._M_impl.field_0x2);
            pcStack_128 = (char *)std::__cxx11::string::c_str();
          }
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar14 = varName;
          existingValue = (char *)this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,pcVar14,&local_1e9);
          pcVar16 = cmState::GetCacheEntryValue(this_00,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          pcVar10 = varName;
          pcVar14 = existingValue;
          local_212 = 0;
          local_213 = 0;
          bVar5 = false;
          local_1c8 = pcVar16;
          if (pcVar16 != (char *)0x0) {
            std::allocator<char>::allocator();
            local_212 = 1;
            std::__cxx11::string::string((string *)&local_210,pcVar10,&local_211);
            local_213 = 1;
            CVar7 = cmState::GetCacheEntryType((cmState *)pcVar14,&local_210);
            bVar5 = CVar7 != UNINITIALIZED;
          }
          if ((local_213 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_210);
          }
          if ((local_212 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_211);
          }
          pcVar14 = varName;
          if ((((bVar5) && ((docstring._7_1_ & 1) != 0)) && ((CacheEntryType)docstring != INTERNAL))
             && ((docstring._6_1_ & 1) == 0)) {
            this_local._7_1_ = 1;
          }
          else {
            if ((docstring._7_1_ & 1) == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_260,pcVar14,&local_261);
              pcVar14 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,&local_260,pcVar14);
              std::__cxx11::string::~string((string *)&local_260);
              std::allocator<char>::~allocator((allocator<char> *)&local_261);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_238,pcVar14,&local_239);
              pcVar14 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddCacheDefinition
                        (pcVar1,&local_238,pcVar14,pcStack_128,(CacheEntryType)docstring,
                         (bool)(docstring._6_1_ & 1));
              std::__cxx11::string::~string((string *)&local_238);
              std::allocator<char>::~allocator((allocator<char> *)&local_239);
            }
            this_local._7_1_ = 1;
          }
          goto LAB_004eb7d1;
        }
      }
LAB_004eb28a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a8,"given invalid arguments for CACHE mode.",
                 (allocator *)((long)&cacheStart + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cacheStart + 7));
      this_local._7_1_ = 0;
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_180,pcVar14,&local_181);
      pcVar14 = (char *)std::__cxx11::string::c_str();
      cmMakefile::RaiseScope(pcVar1,&local_180,pcVar14);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      this_local._7_1_ = 1;
    }
LAB_004eb7d1:
    local_a4 = 1;
    std::__cxx11::string::~string((string *)&type);
    goto LAB_004eb7ed;
  }
  sVar9 = strlen(varName);
  pcVar14 = (char *)operator_new__(sVar9);
  pcVar10 = varName + 4;
  putEnvArg.field_2._8_8_ = pcVar14;
  sVar9 = strlen(varName);
  strncpy(pcVar14,pcVar10,sVar9 - 5);
  uVar2 = putEnvArg.field_2._8_8_;
  sVar9 = strlen(varName);
  uVar3 = putEnvArg.field_2._8_8_;
  *(undefined1 *)((sVar9 - 5) + uVar2) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_90,(char *)uVar3,(allocator *)((long)&currValue + 7))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&currValue + 7));
  std::__cxx11::string::operator+=((string *)local_90,"=");
  local_a0 = getenv((char *)putEnvArg.field_2._8_8_);
  if (putEnvArg.field_2._8_8_ != 0) {
    operator_delete__((void *)putEnvArg.field_2._8_8_);
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (sVar8 < 2) {
LAB_004eac96:
    if (local_a0 != (char *)0x0) {
      cmsys::SystemTools::PutEnv((string *)local_90);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local,1);
    uVar11 = std::__cxx11::string::empty();
    pcVar14 = local_a0;
    if ((uVar11 & 1) != 0) goto LAB_004eac96;
    if (local_a0 == (char *)0x0) {
LAB_004eac1d:
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,1);
      std::__cxx11::string::operator+=((string *)local_90,(string *)pvVar12);
      cmsys::SystemTools::PutEnv((string *)local_90);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,1);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iVar6 = strcmp(pcVar14,pcVar10);
      if (iVar6 != 0) goto LAB_004eac1d;
    }
  }
  this_local._7_1_ = 1;
  local_a4 = 1;
  std::__cxx11::string::~string((string *)local_90);
LAB_004eb7ed:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSetCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *varName = new char [strlen(variable)];
    strncpy(varName,variable+4,strlen(variable)-5);
    varName[strlen(variable)-5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    const char *currValue = getenv(varName);
    delete [] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty())
      {
      // but only if it is different from current value
      if (!currValue || strcmp(currValue,args[1].c_str()))
        {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
        }
      return true;
      }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValue)
      {
      cmSystemTools::PutEnv(putEnvArg);
      }
    return true;
    }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
                            // in the parent scope.
  else if (args.size() == 2 && args[args.size()-1] == "PARENT_SCOPE")
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmState::CacheEntryType type
    = cmState::STRING; // required if cache
  const char* docstring = 0; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size()-1] == "PARENT_SCOPE")
    {
    parentScope = true;
    ignoreLastArgs++;
    }
  else
    {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size()-1] == "FORCE")
      {
      force = true;
      ignoreLastArgs++;
      }

    // check for cache signature
    if (args.size() > 3 && args[args.size() - 3 - (force ? 1 : 0)] == "CACHE")
      {
      cache = true;
      ignoreLastArgs+=3;
      }
    }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope)
    {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
    }


  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache))
    {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
    }

  if(cache)
    {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart+1].c_str());
    docstring = args[cacheStart+2].c_str();
    }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if(existingValue &&
      (state->GetCacheEntryType(variable) != cmState::UNINITIALIZED))
    {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if(cache && type != cmState::INTERNAL && !force)
      {
      return true;
      }
    }

  // if it is meant to be in the cache then define it in the cache
  if(cache)
    {
    this->Makefile->AddCacheDefinition(variable,
                                   value.c_str(),
                                   docstring,
                                   type, force);
    }
  else
    {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
    }
  return true;
}